

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::parseFactor(StructuralParser *this)

{
  Allocator *pAVar1;
  bool bVar2;
  Expression *expression;
  QualifiedIdentifier *expression_00;
  undefined8 extraout_RDX;
  char *pcVar3;
  complex<double> v;
  undefined1 local_2f8 [8];
  pool_ptr<soul::AST::Expression> type;
  undefined1 local_2a8 [72];
  pool_ptr<soul::AST::NoopStatement> local_260;
  string_view local_258;
  uint32_t local_244;
  Value local_240;
  char *local_200;
  complex<double> local_1f8;
  Value local_1e8;
  char *local_1a8;
  complex<float> local_1a0;
  Value local_198;
  char *local_158;
  Value local_150;
  char *local_110;
  Value local_108;
  char *local_c8;
  Value local_c0;
  char *local_80;
  Value local_68;
  char *local_28;
  char *local_20;
  StructuralParser *local_18;
  StructuralParser *this_local;
  
  local_20 = "(";
  local_18 = this;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573c42);
  if (bVar2) {
    this_local = (StructuralParser *)parseParenthesisedExpression(this);
  }
  else {
    local_28 = "$integer32";
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)"$integer32");
    if (bVar2) {
      soul::Value::createInt32<long>(&local_68,(this->super_SOULTokeniser).literalIntValue);
      this_local = (StructuralParser *)createLiteral(this,&local_68);
      soul::Value::~Value(&local_68);
    }
    else {
      local_80 = "$integer64";
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)"$integer64");
      if (bVar2) {
        soul::Value::createInt64<long>(&local_c0,(this->super_SOULTokeniser).literalIntValue);
        this_local = (StructuralParser *)createLiteral(this,&local_c0);
        soul::Value::~Value(&local_c0);
      }
      else {
        local_c8 = "$float64";
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)"$float64");
        if (bVar2) {
          soul::Value::Value(&local_108,(this->super_SOULTokeniser).literalDoubleValue);
          this_local = (StructuralParser *)createLiteral(this,&local_108);
          soul::Value::~Value(&local_108);
        }
        else {
          local_110 = "$float32";
          bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,(TokenType)"$float32");
          if (bVar2) {
            soul::Value::Value(&local_150,(float)(this->super_SOULTokeniser).literalDoubleValue);
            this_local = (StructuralParser *)createLiteral(this,&local_150);
            soul::Value::~Value(&local_150);
          }
          else {
            local_158 = "$imag32";
            pcVar3 = "$imag32";
            bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matches(&this->super_SOULTokeniser,(TokenType)"$imag32");
            if (bVar2) {
              std::complex<float>::complex
                        (&local_1a0,0.0,(float)(this->super_SOULTokeniser).literalDoubleValue);
              soul::Value::Value(&local_198,(complex<float>)pcVar3);
              this_local = (StructuralParser *)createLiteral(this,&local_198);
              soul::Value::~Value(&local_198);
            }
            else {
              local_1a8 = "$imag64";
              pcVar3 = "$imag64";
              bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matches(&this->super_SOULTokeniser,(TokenType)"$imag64");
              if (bVar2) {
                std::complex<double>::complex
                          (&local_1f8,0.0,(this->super_SOULTokeniser).literalDoubleValue);
                v._M_value._8_8_ = extraout_RDX;
                v._M_value._0_8_ = pcVar3;
                soul::Value::Value(&local_1e8,v);
                this_local = (StructuralParser *)createLiteral(this,&local_1e8);
                soul::Value::~Value(&local_1e8);
              }
              else {
                local_200 = "$string literal";
                bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matches(&this->super_SOULTokeniser,(TokenType)"$string literal");
                if (bVar2) {
                  pAVar1 = this->allocator;
                  local_258 = (string_view)
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)&(this->super_SOULTokeniser).currentStringValue);
                  local_244 = (uint32_t)
                              StringDictionary::getHandleForString
                                        (&pAVar1->stringDictionary,local_258);
                  soul::Value::createStringLiteral(&local_240,(Handle)local_244);
                  this_local = (StructuralParser *)createLiteral(this,&local_240);
                  soul::Value::~Value(&local_240);
                }
                else {
                  local_260.object = (NoopStatement *)0x571d88;
                  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matches(&this->super_SOULTokeniser,(TokenType)0x571d88);
                  if (bVar2) {
                    soul::Value::Value((Value *)(local_2a8 + 8),true);
                    this_local = (StructuralParser *)createLiteral(this,(Value *)(local_2a8 + 8));
                    soul::Value::~Value((Value *)(local_2a8 + 8));
                  }
                  else {
                    local_2a8._0_8_ =
                         (long)"Comparison with bounded integer type is always false" + 0x2f;
                    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::matches(&this->super_SOULTokeniser,(TokenType)0x571dbc);
                    if (bVar2) {
                      soul::Value::Value((Value *)&stack0xfffffffffffffd18,false);
                      this_local = (StructuralParser *)
                                   createLiteral(this,(Value *)&stack0xfffffffffffffd18);
                      soul::Value::~Value((Value *)&stack0xfffffffffffffd18);
                    }
                    else {
                      type.object = (Expression *)0x570035;
                      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              ::matchIf<soul::TokenType>
                                        (&this->super_SOULTokeniser,(TokenType)0x570035);
                      if (bVar2) {
                        this_local = (StructuralParser *)parseProcessorProperty(this);
                      }
                      else {
                        tryParsingType((StructuralParser *)local_2f8,(ParseTypeContext)this);
                        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_2f8);
                        if (bVar2) {
                          expression = pool_ptr<soul::AST::Expression>::operator*
                                                 ((pool_ptr<soul::AST::Expression> *)local_2f8);
                          this_local = (StructuralParser *)parseSuffixes(this,expression);
                        }
                        pool_ptr<soul::AST::Expression>::~pool_ptr
                                  ((pool_ptr<soul::AST::Expression> *)local_2f8);
                        if (!bVar2) {
                          expression_00 = parseQualifiedIdentifier(this);
                          this_local = (StructuralParser *)
                                       parseSuffixes(this,&expression_00->super_Expression);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseFactor()
    {
        if (matchIf (Operator::openParen))     return parseParenthesisedExpression();
        if (matches (Token::literalInt32))     return createLiteral (Value::createInt32 (literalIntValue));
        if (matches (Token::literalInt64))     return createLiteral (Value::createInt64 (literalIntValue));
        if (matches (Token::literalFloat64))   return createLiteral (Value (literalDoubleValue));
        if (matches (Token::literalFloat32))   return createLiteral (Value (static_cast<float> (literalDoubleValue)));
        if (matches (Token::literalImag32))    return createLiteral (Value (std::complex (0.0f, static_cast<float> (literalDoubleValue))));
        if (matches (Token::literalImag64))    return createLiteral (Value (std::complex (0.0, static_cast<double> (literalDoubleValue))));
        if (matches (Token::literalString))    return createLiteral (Value::createStringLiteral (allocator.stringDictionary.getHandleForString (currentStringValue)));
        if (matches (Keyword::true_))          return createLiteral (Value (true));
        if (matches (Keyword::false_))         return createLiteral (Value (false));
        if (matchIf (Keyword::processor))      return parseProcessorProperty();

        if (auto type = tryParsingType (ParseTypeContext::nameOrType))
            return parseSuffixes (*type);

        return parseSuffixes (parseQualifiedIdentifier());
    }